

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

ParseResult * read_object(ParseResult *__return_storage_ptr__,istream *is)

{
  parse_result_t pVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  int iVar4;
  ast_type_t aVar5;
  ParseResult *pPVar6;
  ulong uVar7;
  element_type *peVar8;
  shared_ptr<ASTNode> local_4b0;
  allocator local_499;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  shared_ptr<ASTNode> local_458;
  ParseResult local_448;
  shared_ptr<ASTNode> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  string local_3e0;
  string local_3c0;
  allocator local_399;
  string local_398;
  shared_ptr<ASTNode> local_378;
  shared_ptr<ASTNode> local_368;
  shared_ptr<ASTNode> local_358;
  allocator local_341;
  string local_340;
  ParseResult local_320;
  allocator local_2e1;
  string local_2e0;
  ParseResult local_2c0;
  shared_ptr<ASTNode> local_288;
  allocator local_271;
  string local_270;
  ParseResult local_250;
  shared_ptr<ASTNode> local_218;
  allocator local_201;
  string local_200;
  ParseResult local_1e0;
  shared_ptr<ASTNode> local_1a8;
  ParseResult local_198;
  shared_ptr<ASTNode> local_160;
  allocator local_149;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  int local_e4;
  undefined1 local_e0 [4];
  int i;
  string oct;
  string local_b8;
  int local_94;
  undefined1 local_90 [8];
  ParseResult result;
  string charname;
  int c;
  undefined1 local_28 [8];
  shared_ptr<ASTNode> o;
  istream *is_local;
  
  o.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)is;
  std::make_shared<ASTNode>();
  skip_whitespace((istream *)
                  o.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  charname.field_2._8_4_ = std::istream::get();
  std::__cxx11::string::string((string *)(result.error.field_2._M_local_buf + 8));
  ParseResult::ParseResult((ParseResult *)local_90);
  _Var2 = o.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  switch(charname.field_2._8_4_) {
  case 0x22:
    peVar8 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_28);
    peVar8->type = STRING;
    charname.field_2._8_4_ = std::istream::get();
    while (charname.field_2._8_4_ != -1 && charname.field_2._8_4_ != 0x22) {
      if (charname.field_2._8_4_ == 0x5c) {
        iVar4 = std::istream::get();
        if (iVar4 == 0x6e) {
          peVar8 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_28);
          std::__cxx11::string::push_back((char)peVar8 + '\b');
        }
        else if (iVar4 == 0x74) {
          peVar8 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_28);
          std::__cxx11::string::push_back((char)peVar8 + '\b');
        }
        else if (iVar4 == 0x66) {
          peVar8 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_28);
          std::__cxx11::string::push_back((char)peVar8 + '\b');
        }
        else if ((iVar4 < 0x30) || (0x37 < iVar4)) {
          peVar8 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_28);
          std::__cxx11::string::push_back((char)peVar8 + '\b');
        }
        else {
          std::__cxx11::string::string((string *)local_e0);
          for (local_e4 = 0; local_e4 < 2; local_e4 = local_e4 + 1) {
            std::__cxx11::string::push_back((char)local_e0);
            iVar4 = std::istream::get();
            if ((iVar4 < 0x30) || (0x37 < iVar4)) {
              std::operator+(&local_128,"Invalid escape sequence: \\",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_e0);
              charname.field_2._M_local_buf[8] = (char)iVar4;
              std::operator+(&local_108,&local_128,charname.field_2._M_local_buf[8]);
              ParseResult::ParseResult(__return_storage_ptr__,&local_108);
              std::__cxx11::string::~string((string *)&local_108);
              std::__cxx11::string::~string((string *)&local_128);
              local_94 = 1;
              goto LAB_0012bc7a;
            }
          }
          std::__cxx11::string::push_back((char)local_e0);
          peVar8 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_28);
          parse_oct_char((string *)local_e0);
          std::__cxx11::string::push_back((char)peVar8 + '\b');
          local_94 = 0;
LAB_0012bc7a:
          std::__cxx11::string::~string((string *)local_e0);
          if (local_94 != 0) goto LAB_0012cc2b;
        }
      }
      else {
        peVar8 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_28);
        std::__cxx11::string::push_back((char)peVar8 + '\b');
      }
      charname.field_2._8_4_ = std::istream::get();
    }
    if (charname.field_2._8_4_ == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_148,"Unclosed string literal",&local_149);
      ParseResult::ParseResult(__return_storage_ptr__,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
      local_94 = 1;
    }
    else {
      std::shared_ptr<ASTNode>::shared_ptr(&local_160,(shared_ptr<ASTNode> *)local_28);
      ParseResult::ParseResult(__return_storage_ptr__,&local_160);
      std::shared_ptr<ASTNode>::~shared_ptr(&local_160);
      local_94 = 1;
    }
    break;
  case 0x23:
    iVar4 = std::istream::get();
    iVar4 = tolower(iVar4);
    if (iVar4 != 0x21) {
      if ((iVar4 == 0x28) || (iVar4 == 0x5b)) {
        read_list(&local_448,
                  (istream *)
                  o.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
                  (shared_ptr<ASTNode> *)local_28,iVar4 == 0x5b);
        pPVar6 = ParseResult::operator=((ParseResult *)local_90,&local_448);
        pVar1 = pPVar6->result;
        ParseResult::~ParseResult(&local_448);
        if (pVar1 == OK) {
          peVar8 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_28);
          peVar8->type = VECTOR;
          std::shared_ptr<ASTNode>::shared_ptr(&local_458,(shared_ptr<ASTNode> *)local_28);
          ParseResult::ParseResult(__return_storage_ptr__,&local_458);
          std::shared_ptr<ASTNode>::~shared_ptr(&local_458);
          local_94 = 1;
        }
        else {
          ParseResult::ParseResult(__return_storage_ptr__,(ParseResult *)local_90);
          local_94 = 1;
        }
      }
      else if (iVar4 == 0x5c) {
        peVar8 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_28);
        peVar8->type = CHAR;
        iVar4 = std::istream::get();
        if (iVar4 == -1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_398,"Invalid character",&local_399);
          ParseResult::ParseResult(__return_storage_ptr__,&local_398);
          std::__cxx11::string::~string((string *)&local_398);
          std::allocator<char>::~allocator((allocator<char> *)&local_399);
          local_94 = 1;
        }
        else {
          std::__cxx11::string::clear();
          std::__cxx11::string::push_back((char)&result + '0');
          charname.field_2._8_4_ = std::istream::peek();
          while (bVar3 = is_delimiter(charname.field_2._8_4_), ((bVar3 ^ 0xffU) & 1) != 0) {
            std::__cxx11::string::push_back((char)&result + '0');
            std::istream::get();
            charname.field_2._8_4_ = std::istream::peek();
          }
          std::__cxx11::string::string
                    ((string *)&local_3e0,(string *)(result.error.field_2._M_local_buf + 8));
          normalize_char_name(&local_3c0,&local_3e0);
          peVar8 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_28);
          std::__cxx11::string::operator=((string *)&peVar8->value,(string *)&local_3c0);
          std::__cxx11::string::~string((string *)&local_3c0);
          std::__cxx11::string::~string((string *)&local_3e0);
          std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     local_28);
          uVar7 = std::__cxx11::string::empty();
          if ((uVar7 & 1) == 0) {
            std::shared_ptr<ASTNode>::shared_ptr(&local_410,(shared_ptr<ASTNode> *)local_28);
            ParseResult::ParseResult(__return_storage_ptr__,&local_410);
            std::shared_ptr<ASTNode>::~shared_ptr(&local_410);
            local_94 = 1;
          }
          else {
            std::operator+(&local_400,"Invalid character: #\\",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&result.error.field_2 + 8));
            ParseResult::ParseResult(__return_storage_ptr__,&local_400);
            std::__cxx11::string::~string((string *)&local_400);
            local_94 = 1;
          }
        }
      }
      else if (iVar4 == 0x66) {
        peVar8 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_28);
        peVar8->type = BOOL;
        peVar8 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_28);
        std::__cxx11::string::operator=((string *)&peVar8->value,"f");
        std::shared_ptr<ASTNode>::shared_ptr(&local_378,(shared_ptr<ASTNode> *)local_28);
        ParseResult::ParseResult(__return_storage_ptr__,&local_378);
        std::shared_ptr<ASTNode>::~shared_ptr(&local_378);
        local_94 = 1;
      }
      else if (iVar4 == 0x74) {
        peVar8 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_28);
        peVar8->type = BOOL;
        peVar8 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_28);
        std::__cxx11::string::operator=((string *)&peVar8->value,"t");
        std::shared_ptr<ASTNode>::shared_ptr(&local_368,(shared_ptr<ASTNode> *)local_28);
        ParseResult::ParseResult(__return_storage_ptr__,&local_368);
        std::shared_ptr<ASTNode>::~shared_ptr(&local_368);
        local_94 = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_498,"Invalid sequence: #",&local_499);
        charname.field_2._M_local_buf[8] = (char)iVar4;
        std::operator+(&local_478,&local_498,charname.field_2._M_local_buf[8]);
        ParseResult::ParseResult(__return_storage_ptr__,&local_478);
        std::__cxx11::string::~string((string *)&local_478);
        std::__cxx11::string::~string((string *)&local_498);
        std::allocator<char>::~allocator((allocator<char> *)&local_499);
        local_94 = 1;
      }
      break;
    }
    peVar8 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_28);
    std::__cxx11::string::operator=((string *)&peVar8->value,"#!");
    charname.field_2._8_4_ = std::istream::get();
  default:
    peVar8 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_28);
    tolower(charname.field_2._8_4_);
    std::__cxx11::string::push_back((char)peVar8 + '\b');
    charname.field_2._8_4_ = std::istream::peek();
    while (bVar3 = is_delimiter(charname.field_2._8_4_), ((bVar3 ^ 0xffU) & 1) != 0) {
      peVar8 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_28);
      tolower(charname.field_2._8_4_);
      std::__cxx11::string::push_back((char)peVar8 + '\b');
      std::istream::get();
      charname.field_2._8_4_ = std::istream::peek();
    }
    peVar8 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_28);
    aVar5 = identifier_type(&peVar8->value);
    peVar8 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_28);
    peVar8->type = aVar5;
    std::shared_ptr<ASTNode>::shared_ptr(&local_4b0,(shared_ptr<ASTNode> *)local_28);
    ParseResult::ParseResult(__return_storage_ptr__,&local_4b0);
    std::shared_ptr<ASTNode>::~shared_ptr(&local_4b0);
    local_94 = 1;
    break;
  case 0x27:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_200,"quote",&local_201);
    read_quoted(&local_1e0,(istream *)_Var2._M_pi,(shared_ptr<ASTNode> *)local_28,&local_200);
    pPVar6 = ParseResult::operator=((ParseResult *)local_90,&local_1e0);
    pVar1 = pPVar6->result;
    ParseResult::~ParseResult(&local_1e0);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
    if (pVar1 == OK) {
      std::shared_ptr<ASTNode>::shared_ptr(&local_218,(shared_ptr<ASTNode> *)local_28);
      ParseResult::ParseResult(__return_storage_ptr__,&local_218);
      std::shared_ptr<ASTNode>::~shared_ptr(&local_218);
      local_94 = 1;
    }
    else {
      ParseResult::ParseResult(__return_storage_ptr__,(ParseResult *)local_90);
      local_94 = 1;
    }
    break;
  case 0x28:
  case 0x5b:
    read_list(&local_198,
              (istream *)o.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              ,(shared_ptr<ASTNode> *)local_28,charname.field_2._8_4_ == 0x5b);
    pPVar6 = ParseResult::operator=((ParseResult *)local_90,&local_198);
    pVar1 = pPVar6->result;
    ParseResult::~ParseResult(&local_198);
    if (pVar1 == OK) {
      std::shared_ptr<ASTNode>::shared_ptr(&local_1a8,(shared_ptr<ASTNode> *)local_28);
      ParseResult::ParseResult(__return_storage_ptr__,&local_1a8);
      std::shared_ptr<ASTNode>::~shared_ptr(&local_1a8);
      local_94 = 1;
    }
    else {
      ParseResult::ParseResult(__return_storage_ptr__,(ParseResult *)local_90);
      local_94 = 1;
    }
    break;
  case 0x29:
  case 0x5d:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_b8,"Invalid syntax",(allocator *)(oct.field_2._M_local_buf + 0xf));
    ParseResult::ParseResult(__return_storage_ptr__,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)(oct.field_2._M_local_buf + 0xf));
    local_94 = 1;
    break;
  case 0x2c:
    iVar4 = std::istream::peek();
    _Var2 = o.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    if (iVar4 == 0x40) {
      std::istream::get();
      _Var2 = o.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2e0,"unquote-splicing",&local_2e1);
      read_quoted(&local_2c0,(istream *)_Var2._M_pi,(shared_ptr<ASTNode> *)local_28,&local_2e0);
      pPVar6 = ParseResult::operator=((ParseResult *)local_90,&local_2c0);
      pVar1 = pPVar6->result;
      ParseResult::~ParseResult(&local_2c0);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
      if (pVar1 != OK) {
        ParseResult::ParseResult(__return_storage_ptr__,(ParseResult *)local_90);
        local_94 = 1;
        break;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_340,"unquote",&local_341);
      read_quoted(&local_320,(istream *)_Var2._M_pi,(shared_ptr<ASTNode> *)local_28,&local_340);
      pPVar6 = ParseResult::operator=((ParseResult *)local_90,&local_320);
      pVar1 = pPVar6->result;
      ParseResult::~ParseResult(&local_320);
      std::__cxx11::string::~string((string *)&local_340);
      std::allocator<char>::~allocator((allocator<char> *)&local_341);
      if (pVar1 != OK) {
        ParseResult::ParseResult(__return_storage_ptr__,(ParseResult *)local_90);
        local_94 = 1;
        break;
      }
    }
    std::shared_ptr<ASTNode>::shared_ptr(&local_358,(shared_ptr<ASTNode> *)local_28);
    ParseResult::ParseResult(__return_storage_ptr__,&local_358);
    std::shared_ptr<ASTNode>::~shared_ptr(&local_358);
    local_94 = 1;
    break;
  case 0x60:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_270,"quasiquote",&local_271);
    read_quoted(&local_250,(istream *)_Var2._M_pi,(shared_ptr<ASTNode> *)local_28,&local_270);
    pPVar6 = ParseResult::operator=((ParseResult *)local_90,&local_250);
    pVar1 = pPVar6->result;
    ParseResult::~ParseResult(&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
    if (pVar1 == OK) {
      std::shared_ptr<ASTNode>::shared_ptr(&local_288,(shared_ptr<ASTNode> *)local_28);
      ParseResult::ParseResult(__return_storage_ptr__,&local_288);
      std::shared_ptr<ASTNode>::~shared_ptr(&local_288);
      local_94 = 1;
    }
    else {
      ParseResult::ParseResult(__return_storage_ptr__,(ParseResult *)local_90);
      local_94 = 1;
    }
    break;
  case 0xffffffff:
    ParseResult::ParseResult(__return_storage_ptr__);
    local_94 = 1;
  }
LAB_0012cc2b:
  ParseResult::~ParseResult((ParseResult *)local_90);
  std::__cxx11::string::~string((string *)(result.error.field_2._M_local_buf + 8));
  std::shared_ptr<ASTNode>::~shared_ptr((shared_ptr<ASTNode> *)local_28);
  return __return_storage_ptr__;
}

Assistant:

ParseResult read_object(std::istream &is)
{
    auto o = std::make_shared<ASTNode>();
    skip_whitespace(is);
    int c = is.get();
    std::string charname;
    ParseResult result;
    switch(c)
    {
        case EOF:
            return ParseResult();
        case ')':
        case ']':
            return ParseResult("Invalid syntax");
        case '"':
            o->type = ast_type_t::STRING;
            c = is.get();
            while(c != EOF && c != '"')
            {
                if(c == '\\')
                {
                    c = is.get();
                    if(c == 'n')
                        o->value.push_back('\n');
                    else if(c == 't')
                        o->value.push_back('\t');
                    else if(c == 'f')
                        o->value.push_back('\f');
                    else if('0' <= c && c <= '7')
                    {
                        std::string oct;
                        for(int i = 0; i < 2; ++i)
                        {
                            oct.push_back(c);
                            c = is.get();
                            if(!('0' <= c && c <= '7'))
                                return ParseResult("Invalid escape sequence: \\" + oct + char(c));
                        }
                        oct.push_back(c);
                        o->value.push_back(parse_oct_char(oct));
                    }
                    else
                        o->value.push_back(c);
                }
                else
                    o->value.push_back(c);
                c = is.get();
            }
            if(c == EOF)
                return ParseResult("Unclosed string literal");
            return o;
        case '(':
        case '[':
            if((result = read_list(is, o, c == '[')).result != parse_result_t::OK)
                return result;
            return o;
        case '\'':
            if((result = read_quoted(is, o, "quote")).result != parse_result_t::OK)
                return result;
            return o;
        case '`':
            if((result = read_quoted(is, o, "quasiquote")).result != parse_result_t::OK)
                return result;
            return o;
        case ',':
            if(is.peek() == '@')
            {
                is.get();
                if((result = read_quoted(is, o, "unquote-splicing")).result != parse_result_t::OK)
                    return result;
            }
            else
            {
                if((result = read_quoted(is, o, "unquote")).result != parse_result_t::OK)
                    return result;
            }
            return o;
        case '#':
            c = tolower(is.get());
            switch(c)
            {
                case 't':
                    o->type = ast_type_t::BOOL;
                    o->value = "t";
                    return o;
                case 'f':
                    o->type = ast_type_t::BOOL;
                    o->value = "f";
                    return o;
                case '\\':
                    o->type = ast_type_t::CHAR;
                    c = is.get();
                    if(c == EOF)
                        return ParseResult("Invalid character");
                    charname.clear();
                    charname.push_back(c);
                    c = is.peek();
                    while(!is_delimiter(c))
                    {
                        charname.push_back(c);
                        is.get();
                        c = is.peek();
                    }
                    o->value = normalize_char_name(charname);
                    if(o->value.empty())
                        return ParseResult("Invalid character: #\\" + charname);
                    return o;
                case '(':
                case '[':
                    if((result = read_list(is, o, c == '[')).result != parse_result_t::OK)
                        return result;
                    o->type = ast_type_t::VECTOR;
                    return o;
                case '!':
                    o->value = "#!";
                    c = is.get();
                    break;
                default:
                    return ParseResult(std::string("Invalid sequence: #") + char(c));
            }
        default:
            o->value.push_back(tolower(c));
            c = is.peek();
            while(!is_delimiter(c))
            {
                o->value.push_back(tolower(c));
                is.get();
                c = is.peek();
            }
            o->type = identifier_type(o->value);
            return o;
    }
}